

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_define_foreign_aux
               (sexp ctx,sexp env,char *name,int num_args,int flags,char *fname,sexp_proc1 f,
               sexp data)

{
  sexp_gc_var_t *psVar1;
  sexp ctx_00;
  sexp in_RSI;
  undefined8 in_RDI;
  char *unaff_retaddr;
  sexp in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp sym;
  sexp_proc1 in_stack_ffffffffffffffa0;
  sexp key;
  sexp env_00;
  char *name_00;
  undefined8 data_00;
  
  data_00 = &DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  name_00 = &DAT_0000043e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  psVar1 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  key = (sexp)&stack0xffffffffffffffb8;
  env_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa8;
  ctx_00 = sexp_make_foreign((sexp)&stack0xffffffffffffffd0,name_00,(int)((ulong)env_00 >> 0x20),
                             (int)env_00,(char *)key,in_stack_ffffffffffffffa0,(sexp)data_00);
  if ((((ulong)ctx_00 & 3) != 0) || (ctx_00->tag != 0x13)) {
    sexp_intern(in_stack_00000008,unaff_retaddr,in_RDI);
    sexp_env_define(ctx_00,env_00,key,in_RSI);
  }
  (((sexp)in_RDI)->value).context.saves = psVar1;
  return ctx_00;
}

Assistant:

sexp sexp_define_foreign_aux (sexp ctx, sexp env, const char *name, int num_args,
                              int flags, const char *fname, sexp_proc1 f, sexp data) {
  sexp_gc_var2(sym, res);
  sexp_gc_preserve2(ctx, sym, res);
  res = sexp_make_foreign(ctx, name, num_args, flags, fname, f, data);
  if (!sexp_exceptionp(res))
    sexp_env_define(ctx, env, sym = sexp_intern(ctx, name, -1), res);
  sexp_gc_release2(ctx);
  return res;
}